

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlparser.cpp
# Opt level: O0

void __thiscall ControlParser::parseTimeOfDaySetting(ControlParser *this)

{
  byte bVar1;
  int iVar2;
  InputError *pIVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [38];
  undefined1 local_8a;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [8];
  string strUnits;
  string local_30 [8];
  string strTime;
  ControlParser *this_local;
  
  std::__cxx11::string::string(local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  bVar1 = std::ios::eof();
  if ((bVar1 & 1) != 0) {
    local_8a = 1;
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"",&local_89);
    InputError::InputError(pIVar3,2,(string *)local_88);
    local_8a = 0;
    __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
  }
  std::operator>>((istream *)this,local_30);
  bVar1 = std::ios::eof();
  if ((bVar1 & 1) == 0) {
    std::operator>>((istream *)this,local_50);
  }
  iVar2 = Utilities::getSeconds((string *)local_30,(string *)local_50);
  this->timeSetting = iVar2;
  if (this->timeSetting < 0) {
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::operator+(local_d0,(char *)local_30);
    std::operator+(local_b0,local_d0);
    InputError::InputError(pIVar3,7,local_b0);
    __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
  }
  this->controlType = 3;
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void ControlParser::parseTimeOfDaySetting()
{
    // ... read time of day
    string strTime;
    string strUnits = "";
    if ( sin.eof() ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    sin >> strTime;
    if ( !sin.eof() ) sin >> strUnits;

    // ... convert time of day to seconds
    timeSetting = Utilities::getSeconds(strTime, strUnits);
    if ( timeSetting < 0 )
    {
        throw InputError(InputError::INVALID_TIME, strTime + " " + strUnits);
    }
    controlType = Control::TIME_OF_DAY;
}